

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O0

crc32c_t __thiscall absl::lts_20250127::crc_internal::CrcCordState::Checksum(CrcCordState *this)

{
  crc32c_t crc_a;
  crc32c_t crc_ab;
  size_t sVar1;
  bool bVar2;
  Rep *pRVar3;
  const_reference pvVar4;
  CrcCordState *this_local;
  
  pRVar3 = rep(this);
  bVar2 = std::
          deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
          ::empty(&pRVar3->prefix_crc);
  if (bVar2) {
    crc32c_t::crc32c_t((crc32c_t *)((long)&this_local + 4),0);
  }
  else {
    bVar2 = IsNormalized(this);
    if (bVar2) {
      pRVar3 = rep(this);
      pvVar4 = std::
               deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ::back(&pRVar3->prefix_crc);
      this_local._4_4_ = (pvVar4->crc).crc_;
    }
    else {
      pRVar3 = rep(this);
      crc_a.crc_ = (pRVar3->removed_prefix).crc.crc_;
      pRVar3 = rep(this);
      pvVar4 = std::
               deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ::back(&pRVar3->prefix_crc);
      crc_ab.crc_ = (pvVar4->crc).crc_;
      pRVar3 = rep(this);
      pvVar4 = std::
               deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ::back(&pRVar3->prefix_crc);
      sVar1 = pvVar4->length;
      pRVar3 = rep(this);
      this_local._4_4_ = RemoveCrc32cPrefix(crc_a,crc_ab,sVar1 - (pRVar3->removed_prefix).length);
    }
  }
  return (crc32c_t)this_local._4_4_;
}

Assistant:

crc32c_t CrcCordState::Checksum() const {
  if (rep().prefix_crc.empty()) {
    return absl::crc32c_t{0};
  }
  if (IsNormalized()) {
    return rep().prefix_crc.back().crc;
  }
  return absl::RemoveCrc32cPrefix(
      rep().removed_prefix.crc, rep().prefix_crc.back().crc,
      rep().prefix_crc.back().length - rep().removed_prefix.length);
}